

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int selectColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  sqlite3 *db_00;
  long lVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  char *local_b0;
  int local_9c;
  int k;
  char *zNewName;
  int iCol;
  Table *pTab;
  Expr *pColExpr;
  char *pcStack_70;
  int nName;
  char *zName;
  Expr *p;
  Column *pCStack_58;
  int nCol;
  Column *pCol;
  Column *aCol;
  int local_40;
  int cnt;
  int j;
  int i;
  sqlite3 *db;
  Column **paCol_local;
  i16 *pnCol_local;
  ExprList *pEList_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (pEList == (ExprList *)0x0) {
    p._4_4_ = 0;
    pCol = (Column *)0x0;
  }
  else {
    p._4_4_ = pEList->nExpr;
    pCol = (Column *)sqlite3DbMallocZero(db_00,p._4_4_ * 0x30);
  }
  *pnCol = (i16)p._4_4_;
  *paCol = pCol;
  cnt = 0;
  pCStack_58 = pCol;
  do {
    if (p._4_4_ <= cnt) {
LAB_0018692b:
      if (db_00->mallocFailed == '\0') {
        pParse_local._4_4_ = 0;
      }
      else {
        for (local_40 = 0; local_40 < cnt; local_40 = local_40 + 1) {
          sqlite3DbFree(db_00,pCol[local_40].zName);
        }
        sqlite3DbFree(db_00,pCol);
        *paCol = (Column *)0x0;
        *pnCol = 0;
        pParse_local._4_4_ = 7;
      }
      return pParse_local._4_4_;
    }
    pTab = (Table *)sqlite3ExprSkipCollate(pEList->a[cnt].pExpr);
    pcVar3 = pEList->a[cnt].zName;
    if (pcVar3 == (char *)0x0) {
      for (; *(char *)&pTab->zName == 'v'; pTab = (Table *)pTab->pSelect) {
      }
      if ((*(char *)&pTab->zName == -0x68) &&
         (lVar1._0_2_ = pTab->iPKey, lVar1._2_2_ = pTab->nCol, lVar1._4_2_ = pTab->nRef,
         lVar1._6_1_ = pTab->tabFlags, lVar1._7_1_ = pTab->keyConf, lVar1 != 0)) {
        zNewName._4_4_ = (int)*(short *)&pTab->pCheck;
        if (zNewName._4_4_ < 0) {
          zNewName._4_4_ = (int)*(short *)(*(long *)&pTab->iPKey + 0x40);
        }
        if (zNewName._4_4_ < 0) {
          local_b0 = "rowid";
        }
        else {
          local_b0 = *(char **)(*(long *)(*(long *)&pTab->iPKey + 8) + (long)zNewName._4_4_ * 0x30);
        }
        pcStack_70 = sqlite3MPrintf(db_00,"%s",local_b0);
      }
      else if (*(char *)&pTab->zName == '\x1a') {
        pcStack_70 = sqlite3MPrintf(db_00,"%s",pTab->aCol);
      }
      else {
        pcStack_70 = sqlite3MPrintf(db_00,"%s",pEList->a[cnt].zSpan);
      }
    }
    else {
      pcStack_70 = sqlite3DbStrDup(db_00,pcVar3);
    }
    if (db_00->mallocFailed != '\0') {
      sqlite3DbFree(db_00,pcStack_70);
      goto LAB_0018692b;
    }
    pColExpr._4_4_ = sqlite3Strlen30(pcStack_70);
    for (local_40 = 0; local_40 < cnt; local_40 = local_40 + 1) {
      iVar2 = sqlite3_stricmp(pCol[local_40].zName,pcStack_70);
      local_9c = pColExpr._4_4_;
      if (iVar2 == 0) {
        do {
          local_9c = local_9c + -1;
          bVar4 = false;
          if (1 < local_9c) {
            bVar4 = (""[(byte)pcStack_70[local_9c]] & 4) != 0;
          }
        } while (bVar4);
        if (pcStack_70[local_9c] == ':') {
          pColExpr._4_4_ = local_9c;
        }
        pcStack_70[pColExpr._4_4_] = '\0';
        pcVar3 = sqlite3MPrintf(db_00,"%s:%d",pcStack_70);
        sqlite3DbFree(db_00,pcStack_70);
        local_40 = -1;
        pcStack_70 = pcVar3;
        if (pcVar3 == (char *)0x0) break;
      }
    }
    pCStack_58->zName = pcStack_70;
    cnt = cnt + 1;
    pCStack_58 = pCStack_58 + 1;
  } while( true );
}

Assistant:

static int selectColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  int cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  Expr *p;                    /* Expression for a single result column */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */

  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
  }else{
    nCol = 0;
    aCol = 0;
  }
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol; i++, pCol++){
    /* Get an appropriate name for the column
    */
    p = sqlite3ExprSkipCollate(pEList->a[i].pExpr);
    if( (zName = pEList->a[i].zName)!=0 ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
      zName = sqlite3DbStrDup(db, zName);
    }else{
      Expr *pColExpr = p;  /* The expression that is the result column name */
      Table *pTab;         /* Table associated with this expression */
      while( pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN && ALWAYS(pColExpr->pTab!=0) ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        pTab = pColExpr->pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = sqlite3MPrintf(db, "%s",
                 iCol>=0 ? pTab->aCol[iCol].zName : "rowid");
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = sqlite3MPrintf(db, "%s", pColExpr->u.zToken);
      }else{
        /* Use the original text of the column expression as its name */
        zName = sqlite3MPrintf(db, "%s", pEList->a[i].zSpan);
      }
    }
    if( db->mallocFailed ){
      sqlite3DbFree(db, zName);
      break;
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append a integer to the name so that it becomes unique.
    */
    nName = sqlite3Strlen30(zName);
    for(j=cnt=0; j<i; j++){
      if( sqlite3StrICmp(aCol[j].zName, zName)==0 ){
        char *zNewName;
        int k;
        for(k=nName-1; k>1 && sqlite3Isdigit(zName[k]); k--){}
        if( zName[k]==':' ) nName = k;
        zName[nName] = 0;
        zNewName = sqlite3MPrintf(db, "%s:%d", zName, ++cnt);
        sqlite3DbFree(db, zName);
        zName = zNewName;
        j = -1;
        if( zName==0 ) break;
      }
    }
    pCol->zName = zName;
  }
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM;
  }
  return SQLITE_OK;
}